

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O1

int vm_get_game_type(char *filename,char *actual_fname,size_t actual_fname_len,char **defexts,
                    size_t defext_count)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int unaff_R12D;
  size_t sVar4;
  int iVar5;
  char cur_fname [4096];
  char local_1038 [4104];
  
  iVar5 = 0;
  iVar1 = access(filename,0);
  if (iVar1 == 0) {
    if (actual_fname_len != 0) {
      strncpy(actual_fname,filename,actual_fname_len);
      actual_fname[actual_fname_len - 1] = '\0';
    }
    iVar1 = vm_get_game_type_for_file(filename);
    return iVar1;
  }
  if (defext_count != 0) {
    sVar3 = 0;
    iVar5 = 0;
    sVar4 = defext_count;
    do {
      strcpy(local_1038,filename);
      os_defext(local_1038,defexts[sVar3]);
      uVar2 = vm_get_game_type_for_file(local_1038);
      if ((int)uVar2 < 1) {
        sVar4 = sVar4 & 0xffffffff;
      }
      else {
        sVar4 = (size_t)uVar2;
        iVar5 = iVar5 + 1;
        if (actual_fname_len != 0) {
          strncpy(actual_fname,local_1038,actual_fname_len);
          actual_fname[actual_fname_len - 1] = '\0';
        }
      }
      unaff_R12D = (int)sVar4;
      sVar3 = sVar3 + 1;
    } while (defext_count != sVar3);
  }
  if (iVar5 != 1) {
    if (iVar5 == 0) {
      unaff_R12D = -1;
    }
    else {
      unaff_R12D = -3;
    }
  }
  return unaff_R12D;
}

Assistant:

int vm_get_game_type(const char *filename,
                     char *actual_fname, size_t actual_fname_len,
                     const char *const *defexts, size_t defext_count)
{
    int good_count;
    int last_good_ver;
    size_t i;

    /* 
     *   If the exact filename as given exists, determine the file type
     *   directly from this file without trying any default extensions.
     */
    if (osfacc(filename) == 0)
    {
        /* the actual filename is exactly what we were given */
        if (actual_fname_len != 0)
        {
            /* copy the filename, limiting it to the buffer length */
            strncpy(actual_fname, filename, actual_fname_len);
            actual_fname[actual_fname_len - 1] = '\0';
        }

        /* return the type according to the file's signature */
        return vm_get_game_type_for_file(filename);
    }
    
    /* presume we won't find any good files using default extensions */
    good_count = 0;

    /* try each default extension supplied */
    for (i = 0 ; i < defext_count ; ++i)
    {
        int cur_ver;
        char cur_fname[OSFNMAX];

        /* 
         *   build the default filename from the given filename and the
         *   current default suffix 
         */
        strcpy(cur_fname, filename);
        os_defext(cur_fname, defexts[i]);

        /* get the version for this file */
        cur_ver = vm_get_game_type_for_file(cur_fname);
        
        /* if it's a valid code, note it and remember it */
        if (vm_ggt_is_valid(cur_ver))
        {
            /* it's a valid file - count it */
            ++good_count;

            /* remember its version as the last good file's version */
            last_good_ver = cur_ver;

            /* remember its name as the last good file's name */
            if (actual_fname_len != 0)
            {
                /* copy the filename, limiting it to the buffer length */
                strncpy(actual_fname, cur_fname, actual_fname_len);
                actual_fname[actual_fname_len - 1] = '\0';
            }
        }
    }

    /*
     *   If we had exactly one good match, return it.  We will already have
     *   filled in actual_fname with the last good filename, so all we need
     *   to do in this case is return the version ID for the last good file. 
     */
    if (good_count == 1)
        return last_good_ver;

    /*
     *   If we didn't find any matches, tell the caller there is no match
     *   for the given filename. 
     */
    if (good_count == 0)
        return VM_GGT_NOT_FOUND;

    /* we found more than one match, so the type is ambiguous */
    return VM_GGT_AMBIG;
}